

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_staging.cc
# Opt level: O2

int __thiscall NarpcStaging::SendBytes(NarpcStaging *this,int socket,uchar *buf,int size)

{
  ostream *poVar1;
  ssize_t sVar2;
  uint uVar3;
  int iVar4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"sending buf of size ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,size);
  std::endl<char,std::char_traits<char>>(poVar1);
  sVar2 = send(socket,buf,(long)size,0);
  poVar1 = std::operator<<((ostream *)&std::cout,"res ");
  iVar4 = (int)sVar2;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar4);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (-1 < iVar4) {
    uVar3 = size - iVar4;
    do {
      if ((int)uVar3 < 1) {
        return uVar3;
      }
      sVar2 = send(socket,buf + (int)(size - uVar3),(ulong)uVar3,0);
      iVar4 = (int)sVar2;
      uVar3 = uVar3 - iVar4;
    } while (-1 < iVar4);
  }
  return iVar4;
}

Assistant:

int NarpcStaging::SendBytes(int socket, unsigned char *buf, int size) {
  cout << "sending buf of size " << size << endl;
  int res = send(socket, buf, (size_t)size, (int)0);
  cout << "res " << res << endl;
  if (res < 0) {
    return res;
  }
  int remaining = size - res;
  while (remaining > 0) {
    int offset = size - remaining;
    res = send(socket, buf + offset, (size_t)remaining, (int)0);
    if (res < 0) {
      return res;
    }
    remaining -= res;
  }
  return remaining;
}